

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O0

int numchanges(int np,poly *sseq,double a)

{
  int *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double f;
  poly *s;
  double lf;
  int changes;
  int *local_30;
  double local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = evalpoly(*in_RSI,(double *)(in_RSI + 2),in_XMM0_Qa);
  for (local_30 = in_RSI + 0x84; local_30 <= in_RSI + (long)in_EDI * 0x84;
      local_30 = local_30 + 0x84) {
    dVar1 = evalpoly(*local_30,(double *)(local_30 + 2),in_XMM0_Qa);
    if (((local_28 == 0.0) && (!NAN(local_28))) || (local_28 * dVar1 < 0.0)) {
      local_1c = local_1c + 1;
    }
    local_28 = dVar1;
  }
  return local_1c;
}

Assistant:

int numchanges(int np, poly *sseq, double a)
   {
   int changes = 0;

   double lf = evalpoly(sseq[0].ord, sseq[0].coef, a);

   poly *s;
   for (s = sseq + 1; s <= sseq + np; s++) {
      double f = evalpoly(s->ord, s->coef, a);
      if (lf == 0.0 || lf * f < 0)
         changes++;
      lf = f;
      }

   return(changes);
   }